

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

bool llama_model_is_recurrent(llama_model *model)

{
  llama_model *model_local;
  bool local_1;
  
  switch(model->arch) {
  case LLM_ARCH_MAMBA:
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case LLM_ARCH_RWKV6:
    local_1 = true;
    break;
  case LLM_ARCH_RWKV6QWEN2:
    local_1 = true;
    break;
  case LLM_ARCH_RWKV7:
    local_1 = true;
    break;
  case LLM_ARCH_ARWKV7:
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool llama_model_is_recurrent(const llama_model * model) {
    switch (model->arch) {
        case     LLM_ARCH_MAMBA:      return true;
        case     LLM_ARCH_RWKV6:      return true;
        case     LLM_ARCH_RWKV6QWEN2: return true;
        case     LLM_ARCH_RWKV7:      return true;
        case     LLM_ARCH_ARWKV7:     return true;
        default: return false;
    }
}